

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O2

void __thiscall IR::BranchInstr::BranchInstr(BranchInstr *this,bool hasBailOutInfo)

{
  Instr::Instr(&this->super_Instr,hasBailOutInfo);
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_01372318;
  this->field_0x58 = this->field_0x58 & 0xe0;
  this->m_branchTarget = (LabelInstr *)0x0;
  this->m_isMultiBranch = false;
  this->m_isHelperToNonHelperBranch = false;
  this->m_leaveConvToBr = false;
  return;
}

Assistant:

BranchInstr(bool hasBailOutInfo = false) : Instr(hasBailOutInfo), m_branchTarget(nullptr), m_isAirlock(false), m_isSwitchBr(false), m_isOrphanedLeave(false), m_areCmpRegisterFlagsUsedLater(false), m_brFinallyToEarlyExit(false)
    {
#if DBG
        m_isMultiBranch = false;
        m_isHelperToNonHelperBranch = false;
        m_leaveConvToBr = false;
#endif
    }